

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O0

bool __thiscall
LoaderLogger::LogMessage
          (LoaderLogger *this,XrLoaderLogMessageSeverityFlagBits message_severity,
          XrLoaderLogMessageTypeFlags message_type,string *message_id,string *command_name,
          string *message,vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  reference this_00;
  pointer pLVar4;
  XrLoaderLogMessageSeverityFlags XVar5;
  XrLoaderLogMessageTypeFlags XVar6;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  *__range1;
  undefined1 local_f8 [7];
  bool exit_app;
  shared_lock<std::shared_timed_mutex> lock;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_d8;
  undefined1 local_c0 [8];
  NamesAndLabels names_and_labels;
  XrLoaderLogMessengerCallbackData callback_data;
  string *message_local;
  string *command_name_local;
  string *message_id_local;
  XrLoaderLogMessageTypeFlags message_type_local;
  XrLoaderLogMessageSeverityFlagBits message_severity_local;
  LoaderLogger *this_local;
  
  names_and_labels.labels.
  super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  names_and_labels.labels.
  super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_d8,objects);
  DebugUtilsData::PopulateNamesAndLabels((NamesAndLabels *)local_c0,&this->data_,&local_d8);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_d8);
  bVar1 = std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::empty
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_c0);
  if (!bVar1) {
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::data
              ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_c0);
  }
  std::vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>::size
            ((vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
              *)&names_and_labels.sdk_objects.
                 super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::empty
                    ((vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)
                     &names_and_labels.objects.
                      super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::data
              ((vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)
               &names_and_labels.objects.
                super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::size
            ((vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)
             &names_and_labels.objects.
              super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::shared_lock<std::shared_timed_mutex>::shared_lock
            ((shared_lock<std::shared_timed_mutex> *)local_f8,&this->_mutex);
  bVar1 = false;
  __end1 = std::
           vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ::begin(&this->_recorders);
  recorder = (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
             std::
             vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
             ::end(&this->_recorders);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_*,_std::vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>_>
                                     *)&recorder), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_*,_std::vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>_>
              ::operator*(&__end1);
    pLVar4 = std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::operator->
                       (this_00);
    XVar5 = LoaderLogRecorder::MessageSeverities(pLVar4);
    if ((XVar5 & message_severity) == message_severity) {
      pLVar4 = std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::
               operator->(this_00);
      XVar6 = LoaderLogRecorder::MessageTypes(pLVar4);
      if ((XVar6 & message_type) == message_type) {
        pLVar4 = std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::
                 operator->(this_00);
        uVar3 = (*pLVar4->_vptr_LoaderLogRecorder[6])
                          (pLVar4,message_severity,message_type,
                           &names_and_labels.labels.
                            super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = bVar1 != false || (uVar3 & 1) != 0;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_*,_std::vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>_>
    ::operator++(&__end1);
  }
  std::shared_lock<std::shared_timed_mutex>::~shared_lock
            ((shared_lock<std::shared_timed_mutex> *)local_f8);
  NamesAndLabels::~NamesAndLabels((NamesAndLabels *)local_c0);
  return bVar1;
}

Assistant:

bool LoaderLogger::LogMessage(XrLoaderLogMessageSeverityFlagBits message_severity, XrLoaderLogMessageTypeFlags message_type,
                              const std::string& message_id, const std::string& command_name, const std::string& message,
                              const std::vector<XrSdkLogObjectInfo>& objects) {
    XrLoaderLogMessengerCallbackData callback_data = {};
    callback_data.message_id = message_id.c_str();
    callback_data.command_name = command_name.c_str();
    callback_data.message = message.c_str();

    auto names_and_labels = data_.PopulateNamesAndLabels(objects);
    callback_data.objects = names_and_labels.sdk_objects.empty() ? nullptr : names_and_labels.sdk_objects.data();
    callback_data.object_count = static_cast<uint8_t>(names_and_labels.objects.size());

    callback_data.session_labels = names_and_labels.labels.empty() ? nullptr : names_and_labels.labels.data();
    callback_data.session_labels_count = static_cast<uint8_t>(names_and_labels.labels.size());

    std::shared_lock<std::shared_timed_mutex> lock(_mutex);
    bool exit_app = false;
    for (std::unique_ptr<LoaderLogRecorder>& recorder : _recorders) {
        if ((recorder->MessageSeverities() & message_severity) == message_severity &&
            (recorder->MessageTypes() & message_type) == message_type) {
            exit_app |= recorder->LogMessage(message_severity, message_type, &callback_data);
        }
    }
    return exit_app;
}